

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateTransformFeedbackVariableBasicTypeCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool reducedSet)

{
  DataType DVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  ResourceTestCase *this;
  deInt32 *pdVar4;
  long lVar5;
  SharedPtr variable;
  SharedPtr local_68;
  TestNode *local_50;
  Context *local_48;
  SharedPtr *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  lVar5 = 0;
  local_50 = &targetGroup->super_TestNode;
  local_48 = context;
  local_40 = parentStructure;
  do {
    if ((generateTransformFeedbackVariableBasicTypeCases::variableTypes[lVar5].important |
        !reducedSet) == 1) {
      pNVar2 = (Node *)operator_new(0x28);
      DVar1 = generateTransformFeedbackVariableBasicTypeCases::variableTypes[lVar5].type;
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b1ef8;
      pNVar2->m_type = TYPE_VARIABLE;
      (pNVar2->m_enclosingNode).m_ptr = local_40->m_ptr;
      pSVar3 = local_40->m_state;
      (pNVar2->m_enclosingNode).m_state = pSVar3;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
        *pdVar4 = *pdVar4 + 1;
        UNLOCK();
      }
      pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021b2070;
      *(DataType *)&pNVar2[1]._vptr_Node = DVar1;
      local_68.m_state = (SharedPtrStateBase *)0x0;
      local_68.m_ptr = pNVar2;
      pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar3->strongRefCount = 0;
      pSVar3->weakRefCount = 0;
      pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021b1f18;
      pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
      pSVar3->strongRefCount = 1;
      pSVar3->weakRefCount = 1;
      local_68.m_state = pSVar3;
      this = (ResourceTestCase *)operator_new(0xb0);
      ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
                (&local_38,PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING,0x800);
      ResourceTestCase::ResourceTestCase(this,local_48,&local_68,&local_38,(char *)0x0);
      tcu::TestNode::addChild(local_50,(TestNode *)this);
      pdVar4 = &pSVar3->strongRefCount;
      LOCK();
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        local_68.m_ptr = (Node *)0x0;
        (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar4 = &(local_68.m_state)->weakRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        if (local_68.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_68.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x15);
  return;
}

Assistant:

static void generateTransformFeedbackVariableBasicTypeCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool reducedSet)
{
	static const struct
	{
		glu::DataType	type;
		bool			important;
	} variableTypes[] =
	{
		{ glu::TYPE_FLOAT,			true	},
		{ glu::TYPE_INT,			true	},
		{ glu::TYPE_UINT,			true	},

		{ glu::TYPE_FLOAT_VEC2,		false	},
		{ glu::TYPE_FLOAT_VEC3,		true	},
		{ glu::TYPE_FLOAT_VEC4,		false	},

		{ glu::TYPE_INT_VEC2,		false	},
		{ glu::TYPE_INT_VEC3,		true	},
		{ glu::TYPE_INT_VEC4,		false	},

		{ glu::TYPE_UINT_VEC2,		true	},
		{ glu::TYPE_UINT_VEC3,		false	},
		{ glu::TYPE_UINT_VEC4,		false	},

		{ glu::TYPE_FLOAT_MAT2,		false	},
		{ glu::TYPE_FLOAT_MAT2X3,	false	},
		{ glu::TYPE_FLOAT_MAT2X4,	false	},
		{ glu::TYPE_FLOAT_MAT3X2,	false	},
		{ glu::TYPE_FLOAT_MAT3,		false	},
		{ glu::TYPE_FLOAT_MAT3X4,	true	},
		{ glu::TYPE_FLOAT_MAT4X2,	false	},
		{ glu::TYPE_FLOAT_MAT4X3,	false	},
		{ glu::TYPE_FLOAT_MAT4,		false	},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(variableTypes); ++ndx)
	{
		if (variableTypes[ndx].important || !reducedSet)
		{
			const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, variableTypes[ndx].type));
			targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_TRANSFORM_FEEDBACK_VARYING, PROGRAMRESOURCEPROP_TYPE)));
		}
	}
}